

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CasesSimp.cpp
# Opt level: O1

VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_> __thiscall
Inferences::CasesSimp::RewriteableSubtermsFn::operator()(RewriteableSubtermsFn *this,Literal *lit)

{
  long *plVar1;
  int *piVar2;
  int iVar3;
  BooleanSubtermIt *this_00;
  IteratorCore<Kernel::TermList> *pIVar4;
  ItemList *pIVar5;
  undefined8 *puVar6;
  Term *in_RDX;
  VirtualIterator<Kernel::TermList> local_38;
  VirtualIterator<Kernel::TermList> local_30;
  undefined8 local_28;
  long *local_20;
  
  this_00 = (BooleanSubtermIt *)::operator_new(0x38);
  Kernel::BooleanSubtermIt::BooleanSubtermIt(this_00,in_RDX,false);
  piVar2 = &(this_00->super_IteratorCore<Kernel::TermList>)._refCnt;
  *piVar2 = *piVar2 + 1;
  local_30._core = (IteratorCore<Kernel::TermList> *)this_00;
  iVar3 = (*(this_00->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore[2])(this_00);
  if ((char)iVar3 == '\0') {
    ::Lib::VirtualIterator<Kernel::TermList>::getEmpty();
  }
  else {
    pIVar4 = (IteratorCore<Kernel::TermList> *)::operator_new(0x20);
    pIVar4->_refCnt = 0;
    pIVar4->_vptr_IteratorCore = (_func_int **)&PTR__UniquePersistentIterator_00b63950;
    pIVar5 = ::Lib::UniquePersistentIterator<Lib::VirtualIterator<Kernel::TermList>_>::
             getUniqueItemList(&local_30,(size_t *)&pIVar4[1]._refCnt);
    pIVar4[1]._vptr_IteratorCore = (_func_int **)pIVar5;
    pIVar4->_refCnt = pIVar4->_refCnt + 1;
    local_38._core = pIVar4;
  }
  ::Lib::pushPairIntoRightIterator<Kernel::Literal*,Lib::VirtualIterator<Kernel::TermList>>
            ((Lib *)&local_28,(Literal *)in_RDX,&local_38);
  puVar6 = (undefined8 *)
           ::Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  if (local_20 != (long *)0x0) {
    *(int *)(local_20 + 1) = (int)local_20[1] + 1;
  }
  *(undefined4 *)(puVar6 + 1) = 0;
  *puVar6 = &PTR__ProxyIterator_00b63798;
  puVar6[2] = local_28;
  puVar6[3] = local_20;
  if (local_20 == (long *)0x0) {
    *(undefined8 **)this = puVar6;
    *(undefined4 *)(puVar6 + 1) = 1;
  }
  else {
    iVar3 = (int)local_20[1];
    *(int *)(local_20 + 1) = iVar3 + 1;
    *(undefined8 **)this = puVar6;
    *(undefined4 *)(puVar6 + 1) = 1;
    *(int *)(local_20 + 1) = iVar3;
    if (iVar3 == 0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  if (local_20 != (long *)0x0) {
    plVar1 = local_20 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  if (local_38._core != (IteratorCore<Kernel::TermList> *)0x0) {
    piVar2 = &(local_38._core)->_refCnt;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*(local_38._core)->_vptr_IteratorCore[1])();
    }
  }
  if ((BooleanSubtermIt *)local_30._core != (BooleanSubtermIt *)0x0) {
    piVar2 = &(local_30._core)->_refCnt;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*((IteratorCore<Kernel::TermList> *)&(local_30._core)->_vptr_IteratorCore)->
        _vptr_IteratorCore[1])();
    }
  }
  return (VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_>)
         (IteratorCore<std::pair<Kernel::Literal_*,_Kernel::TermList>_> *)this;
}

Assistant:

VirtualIterator<pair<Literal*, TermList> > operator()(Literal* lit)
  {
    return pvi( pushPairIntoRightIterator(lit, 
                getUniquePersistentIterator(vi(new BooleanSubtermIt(lit)))));
  }